

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall
CVmImageLoader::run(CVmImageLoader *this,char **argv,int argc,CVmRuntimeSymbols *global_symtab,
                   CVmRuntimeSymbols *macro_symtab,char *saved_state)

{
  uint *puVar1;
  vm_val_t *pvVar2;
  char *__s;
  CVmObjPageEntry *pCVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  CVmImageLoader *this_00;
  void *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  uint uVar9;
  undefined4 extraout_var;
  size_t sVar10;
  undefined4 extraout_var_00;
  CCharmapToUni *pCVar11;
  size_t sVar12;
  char *buf;
  ulong uVar13;
  size_t idx;
  char **ppcVar14;
  long lVar15;
  long *in_FS_OFFSET;
  bool bVar16;
  char *argstr;
  vm_rcdesc rc;
  err_frame_t err_cur__;
  char *local_1a8;
  uint local_1a0;
  uint local_19c;
  char **local_198;
  CVmImageLoader *local_190;
  vm_obj_id_t local_184;
  uint local_180;
  pool_ofs_t local_17c;
  CCharmapToUni *local_178;
  size_t local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  vm_rcdesc local_158;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  local_1a8 = (char *)0x0;
  iVar7 = (*(this->pools_[0]->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore[2])();
  if (CONCAT44(extraout_var,iVar7) == 0) {
    err_throw(0x140);
  }
  if (saved_state == (char *)0x0) {
    local_17c = this->entrypt_;
  }
  else {
    local_17c = G_predef_X.main_restore_func;
    if (G_predef_X.main_restore_func == 0) {
      err_throw(0x14d);
    }
  }
  local_168 = this->runtime_symtab_;
  uStack_160 = this->runtime_macros_;
  G_image_loader_X = this;
  local_198 = argv;
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  local_19c = argc;
  local_190 = this;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  this_00 = local_190;
  if (local_110[0] == 0) {
    bVar16 = G_file_path_X != (char *)0x0;
    if (!bVar16) {
      G_file_path_X = lib_copy_str(local_190->path_);
    }
    uVar9 = local_19c;
    if (global_symtab != (CVmRuntimeSymbols *)0x0) {
      this_00->runtime_symtab_ = global_symtab;
    }
    if (macro_symtab != (CVmRuntimeSymbols *)0x0) {
      this_00->runtime_macros_ = macro_symtab;
    }
    create_global_symtab_lookup_table(this_00);
    pvVar2 = sp_;
    vVar8 = this_00->reflection_symtab_;
    if (vVar8 != 0) {
      pvVar4 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar4 = VM_OBJ;
      (pvVar2->val).obj = vVar8;
    }
    create_macro_symtab_lookup_table(this_00);
    pvVar2 = sp_;
    vVar8 = this_00->reflection_macros_;
    if (vVar8 != 0) {
      pvVar4 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar4 = VM_OBJ;
      (pvVar2->val).obj = vVar8;
    }
    run_static_init(this_00);
    pvVar2 = sp_;
    if (saved_state == (char *)0x0) {
      local_180 = 1;
    }
    else {
      sp_ = sp_ + 1;
      sVar10 = strlen(saved_state);
      vVar8 = CVmObjString::create(0,saved_state,sVar10);
      pvVar2->typ = VM_OBJ;
      (pvVar2->val).obj = vVar8;
      local_180 = 2;
    }
    ppcVar14 = local_198;
    if ((int)uVar9 < 1) {
      pCVar11 = (CCharmapToUni *)0x0;
    }
    else {
      if (G_net_config_X == (TadsNetConfig *)0x0) {
        os_get_charmap((char *)&local_158,4);
      }
      else {
        uVar13 = (ulong)local_158.argp >> 0x20;
        local_158.argp = (vm_val_t *)CONCAT44((uint)uVar13 & 0xffffff00,0x38667475);
      }
      iVar7 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
      pCVar11 = CCharmapToUni::load((CResLoader *)CONCAT44(extraout_var_00,iVar7),(char *)&local_158
                                   );
    }
    local_1a0 = uVar9;
    local_178 = pCVar11;
    if (0 < (int)uVar9) {
      uVar13 = 0;
      do {
        __s = ppcVar14[uVar13];
        if (pCVar11 == (CCharmapToUni *)0x0) {
          sVar10 = strlen(__s);
          local_170 = sVar10;
          buf = (char *)malloc(sVar10 + 1);
          local_1a8 = buf;
          memcpy(buf,__s,sVar10 + 1);
          pCVar11 = local_178;
          ppcVar14 = local_198;
          CCharmapToUni::validate(buf,sVar10);
          sVar12 = local_170;
        }
        else {
          sVar12 = CCharmapToUni::map_str_alo(pCVar11,&local_1a8,__s);
        }
        CVmRun::push_string(&G_interpreter_X,local_1a8,sVar12);
        free(local_1a8);
        local_1a8 = (char *)0x0;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    uVar9 = local_19c;
    sVar12 = (size_t)(int)local_19c;
    local_184 = CVmObjList::create(0,sVar12);
    if (0 < (int)uVar9) {
      uVar9 = local_184 & 0xfff;
      pCVar3 = G_obj_table_X.pages_[local_184 >> 0xc];
      uVar13 = (ulong)local_1a0;
      lVar15 = uVar13 * -0x10;
      idx = 0;
      do {
        CVmObjList::cons_set_element
                  ((CVmObjList *)((long)&pCVar3->ptr_ + (ulong)(uVar9 * 0x18)),idx,
                   (vm_val_t *)((long)&sp_->typ + lVar15));
        idx = idx + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar13 != idx);
    }
    pvVar5 = sp_;
    pvVar2 = sp_ + -sVar12;
    sp_ = sp_ + (1 - sVar12);
    pvVar2->typ = VM_OBJ;
    pvVar5[-sVar12].val.obj = local_184;
    pvVar2 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_PROP;
    (pvVar2->val).prop = 0;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_NIL;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_NIL;
    pvVar2 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_NIL;
    (pvVar2->val).obj = 0;
    pvVar2 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_FUNCPTR;
    (pvVar2->val).obj = local_17c;
    local_158.name = "Main entrypoint";
    local_158.bifptr.typ = VM_NIL;
    local_158.self.typ = VM_NIL;
    local_158.method_idx = 0;
    local_158.argc = 0;
    local_158.argp = (vm_val_t *)0x0;
    local_158.caller_addr = (uchar *)0x0;
    CVmRun::do_call(&G_interpreter_X,0,
                    (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                              [local_17c >>
                               ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem
                             + (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & local_17c)),local_180,
                    &local_158);
    if (local_190->reflection_macros_ != 0) {
      sp_ = sp_ + -1;
    }
    pCVar11 = local_178;
    if (local_190->reflection_symtab_ != 0) {
      sp_ = sp_ + -1;
    }
  }
  else {
    bVar16 = true;
    pCVar11 = (CCharmapToUni *)0x0;
  }
  if (-1 < (short)local_110[0]) {
    local_110[0] = local_110[0] | 0x8000;
    G_image_loader_X = (CVmImageLoader *)0x0;
    *(undefined4 *)&local_190->runtime_symtab_ = (undefined4)local_168;
    *(undefined4 *)((long)&local_190->runtime_symtab_ + 4) = local_168._4_4_;
    *(undefined4 *)&local_190->runtime_macros_ = (undefined4)uStack_160;
    *(undefined4 *)((long)&local_190->runtime_macros_ + 4) = uStack_160._4_4_;
    if (pCVar11 != (CCharmapToUni *)0x0) {
      puVar1 = &(pCVar11->super_CCharmap).ref_cnt_;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pCVar11->super_CCharmap)._vptr_CCharmap[1])();
      }
    }
    if (local_1a8 != (char *)0x0) {
      free(local_1a8);
    }
    if (!bVar16) {
      lib_free_str(G_file_path_X);
      G_file_path_X = (char *)0x0;
    }
  }
  lVar15 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar15;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar6 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar6;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return;
}

Assistant:

void CVmImageLoader::run(VMG_ const char *const *argv, int argc,
                         CVmRuntimeSymbols *global_symtab,
                         CVmRuntimeSymbols *macro_symtab,
                         const char *saved_state)
{
    CVmRuntimeSymbols *orig_runtime_symtab, *orig_runtime_macros;
    pool_ofs_t entry_code_ofs;
    int entry_code_argc;
    CCharmapToUni *argmap = 0;
    char *argstr = 0;
    
    /* make sure we found a code pool definition */
    if (pools_[0]->vmpbs_get_page_count() < 1)
        err_throw(VMERR_IMAGE_NO_CODE);

    /* 
     *   Find the entrypoint.  If we have a saved state, call the function
     *   given by the exported symbol "mainRestore".  Otherwise, call the
     *   exported main entrypoint function.  
     */
    if (saved_state != 0)
    {
        /* 
         *   We're restoring a saved state file immediately on startup - call
         *   the exported "mainRestore" function.  If there is no such
         *   export, we can't run the program with an initial saved state.  
         */
        if (G_predef->main_restore_func == 0)
            err_throw(VMERR_NO_MAINRESTORE);

        /* use the mainRestore export */
        entry_code_ofs = G_predef->main_restore_func;
    }
    else
    {
        /* ordinary startup - use the exported primary entrypoint */
        entry_code_ofs = entrypt_;
    }

    /* we have no arguments to the entrypoint function yet */
    entry_code_argc = 0;

    /* set myself as the global image loader */
    G_image_loader = this;

    /* remember the original runtime symbol table */
    orig_runtime_symtab = runtime_symtab_;
    orig_runtime_macros = runtime_macros_;

    /* we haven't set the file path */
    int file_path_set = FALSE;

    /* catch any errors so we restore globals on the way out */
    err_try
    {
        int i;
        
        /* if there's no file path, use the image file folder by default */
        if (G_file_path == 0)
        {
            G_file_path = lib_copy_str(get_path());
            file_path_set = TRUE;
        }

        /* 
         *   if the caller gave us a runtime symbol table, use it over any
         *   we have already stored 
         */
        if (global_symtab != 0)
            runtime_symtab_ = global_symtab;
        if (macro_symtab != 0)
            runtime_macros_ = macro_symtab;

        /* create a LookupTable for the reflection symbols, if any */
        create_global_symtab_lookup_table(vmg0_);

        /* 
         *   if we successfully created a reflection symbol table, push it
         *   onto the stack - this will ensure that the object won't be
         *   discarded as long as the program is running 
         */
        if (reflection_symtab_ != VM_INVALID_OBJ)
        {
            /* set up an object value for the table and push it */
            G_stk->push()->set_obj(reflection_symtab_);
        }

        /* create and stack the reflection LookupTable for macros */
        create_macro_symtab_lookup_table(vmg0_);
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->push()->set_obj(reflection_macros_);

        /* 
         *   run static initializers (do this after creating the symbol
         *   table, in case any of the initializers want to access the
         *   symbol table) 
         */
        run_static_init(vmg0_);

        /* if there's a saved state file to restore, push it */
        if (saved_state != 0)
        {
            /* create a string object for the filename, and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE,
                                     saved_state, strlen(saved_state)));

            /* count the extra startup argument */
            ++entry_code_argc;
        }

        /* get a character mapper for the command-line arguments */
        if (argc > 0)
        {
            /* 
             *   If we have a net configuration, assume that the arguments
             *   are in UTF-8 format, since they're coming from a web server.
             *   Otherwise, ask the OS which character set to use for
             *   command-line parameters.
             */
            char argcs[40];
            if (G_net_config != 0)
                strcpy(argcs, "utf8");
            else
                os_get_charmap(argcs, OS_CHARMAP_CMDLINE);

            /* load the character set */
            argmap = CCharmapToUni::load(
                G_host_ifc->get_sys_res_loader(), argcs);
        }

        /* 
         *   push a string object for each argument - push them onto the
         *   stack to ensure that they're referenced in case garbage
         *   collection occurs while we're working 
         */
        for (i = 0 ; i < argc ; ++i)
        {
            /* if we have a character mapper, map the argument string */
            size_t slen;
            if (argmap != 0)
            {
                /* map the argument to UTF8 */
                slen = argmap->map_str_alo(&argstr, argv[i]);
            }
            else
            {
                /* make a copy of the string */
                slen = strlen(argv[i]);
                argstr = (char *)t3malloc(slen + 1);
                memcpy(argstr, argv[i], slen + 1);

                /* make sure it's well-formed UTF-8 */
                CCharmapToUni::validate(argstr, slen);
            }

            /* push the mapped/adjusted string argument */
            G_interpreter->push_string(vmg_ argstr, slen);

            /* done with the mapped/adjusted string */
            t3free(argstr);
            argstr = 0;
        }

        /* create a list to hold the strings */
        vm_obj_id_t lst_obj = CVmObjList::create(vmg_ FALSE, argc);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list elements to the strings */
        for (i = 0 ; i < argc ; ++i)
        {
            vm_val_t *strp;
            
            /* 
             *   Get this item from the stack.  Note that the most recently
             *   pushed item is number 0, then number 1, and so on - the
             *   last argument string (at index argc) is thus number 0, and
             *   the first (at index 0) is number argc.  
             */
            strp = G_stk->get(argc - i - 1);

            /* set this list element */
            lst->cons_set_element(i, strp);
        }

        /* 
         *   we don't need the strings themselves any more, as we can reach
         *   them through the list, so drop the strings from the stack 
         */
        G_stk->discard(argc);
        
        /* push the list - it's the argument to the program entrypoint */
        G_stk->push()->set_obj(lst_obj);
        ++entry_code_argc;

        /* 
         *   Invoke the entrypoint function - it takes two arguments (the
         *   list of argument strings, and the name of the initial saved
         *   state file to restore, if any).  
         */
        G_stk->push()->set_propid(VM_INVALID_PROP);
        G_stk->push()->set_nil();
        G_stk->push()->set_nil();
        G_stk->push()->set_nil_obj();
        G_stk->push()->set_fnptr(entry_code_ofs);
        vm_rcdesc rc("Main entrypoint");
        G_interpreter->do_call(
            vmg_ 0,
            (const uchar *)G_code_pool->get_ptr(entry_code_ofs),
            entry_code_argc, &rc);

        /* 
         *   if we pushed a global symbol table LookupTable object, pop it -
         *   we left it on the stack to protect it from the garbage
         *   collector, since it's always implicitly referenced from the
         *   intrinsic function that retrieves the symbol table object 
         */
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->discard();
        if (reflection_symtab_ != VM_INVALID_OBJ)
            G_stk->discard();
    }